

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::FindUVChannels
          (LWOImporter *this,Surface *surf,SortedRep *sorted,Layer *layer,uint *out)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *this_00;
  reference puVar5;
  reference pvVar6;
  Logger *this_01;
  uint *puVar7;
  ulong uVar8;
  bool local_111;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_f8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_f0;
  uint *local_e8;
  uint local_e0;
  uint local_dc;
  byte local_d5;
  uint a;
  char had;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  aiVector2t<float> local_88;
  reference local_80;
  uint local_70;
  uint local_6c;
  uint idx;
  uint n;
  Face *face;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  const_iterator it;
  UVChannel *uv;
  uint i;
  uint num_extra;
  uint extra;
  uint next;
  uint *out_local;
  Layer *layer_local;
  SortedRep *sorted_local;
  Surface *surf_local;
  LWOImporter *this_local;
  
  num_extra = 0;
  i = 0;
  uv._4_4_ = 0;
  uv._0_4_ = 0;
  _extra = out;
  out_local = (uint *)layer;
  layer_local = (Layer *)sorted;
  sorted_local = (SortedRep *)surf;
  surf_local = (Surface *)this;
  do {
    sVar4 = std::vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>::size
                      ((vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_> *)
                       (out_local + 0x1e));
    if (sVar4 <= (uint)uv) {
      if (i < 8) {
        _extra[i] = 0xffffffff;
      }
      return;
    }
    it._M_current =
         (uint *)std::vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>::
                 operator[]((vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                             *)(out_local + 0x1e),(ulong)(uint)uv);
    local_58._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)layer_local);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_50,&local_58);
    while( true ) {
      face = (Face *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)layer_local);
      bVar2 = __gnu_cxx::operator!=
                        (&local_50,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&face);
      if (!bVar2) break;
      this_00 = (vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)(out_local + 0x40);
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_50);
      _idx = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::operator[]
                       (this_00,(ulong)*puVar5);
      local_6c = 0;
      while( true ) {
        if ((_idx->super_aiFace).mNumIndices <= local_6c) goto LAB_006e6aef;
        local_70 = (_idx->super_aiFace).mIndices[local_6c];
        local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)(it._M_current + 0x12),
                              (ulong)local_70);
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_80);
        local_111 = false;
        if (bVar2) {
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(it._M_current + 0xc),0);
          uVar8 = (ulong)local_70;
          aiVector2t<float>::aiVector2t(&local_88);
          local_111 = aiVector2t<float>::operator!=
                                ((aiVector2t<float> *)(pvVar6 + uVar8 * 2),&local_88);
        }
        if (local_111 != false) break;
        local_6c = local_6c + 1;
      }
      if (i < 8) {
        local_d5 = 0;
        bVar3 = FindUVChannels(this,(TextureList *)(sorted_local + 6),(Layer *)out_local,
                               (UVChannel *)it._M_current,num_extra);
        local_d5 = local_d5 | bVar3;
        bVar3 = FindUVChannels(this,(TextureList *)(sorted_local + 7),(Layer *)out_local,
                               (UVChannel *)it._M_current,num_extra);
        local_d5 = local_d5 | bVar3;
        bVar3 = FindUVChannels(this,(TextureList *)(sorted_local + 8),(Layer *)out_local,
                               (UVChannel *)it._M_current,num_extra);
        local_d5 = local_d5 | bVar3;
        bVar3 = FindUVChannels(this,(TextureList *)(sorted_local + 0xb),(Layer *)out_local,
                               (UVChannel *)it._M_current,num_extra);
        local_d5 = local_d5 | bVar3;
        bVar3 = FindUVChannels(this,(TextureList *)(sorted_local + 9),(Layer *)out_local,
                               (UVChannel *)it._M_current,num_extra);
        local_d5 = local_d5 | bVar3;
        bVar3 = FindUVChannels(this,(TextureList *)(sorted_local + 10),(Layer *)out_local,
                               (UVChannel *)it._M_current,num_extra);
        local_d5 = local_d5 | bVar3;
        bVar3 = FindUVChannels(this,(TextureList *)(sorted_local + 0xc),(Layer *)out_local,
                               (UVChannel *)it._M_current,num_extra);
        local_d5 = local_d5 | bVar3;
        if (local_d5 == 0) {
          _extra[i] = (uint)uv;
          uv._4_4_ = uv._4_4_ + 1;
        }
        else {
          if (uv._4_4_ != 0) {
            local_dc = num_extra;
            while( true ) {
              uVar1 = local_dc;
              local_e0 = 7;
              puVar7 = std::min<unsigned_int>(&i,&local_e0);
              if (*puVar7 <= uVar1) break;
              _extra[local_dc + 1] = _extra[local_dc];
              local_dc = local_dc + 1;
            }
          }
          _extra[num_extra] = (uint)uv;
          num_extra = num_extra + 1;
        }
        i = i + 1;
      }
      else {
        this_01 = DefaultLogger::get();
        std::operator+(&local_c8,
                       "LWO: Maximum number of UV channels for this mesh reached. Skipping channel \'"
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (it._M_current + 2));
        std::operator+(&local_a8,&local_c8,"\'");
        Logger::error(this_01,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      local_f8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)layer_local);
      local_f0 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator-(&local_f8,1);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_e8,&local_f0);
      local_50._M_current = local_e8;
LAB_006e6aef:
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_50);
    }
    uv._0_4_ = (uint)uv + 1;
  } while( true );
}

Assistant:

void LWOImporter::FindUVChannels(LWO::Surface& surf,
    LWO::SortedRep& sorted,LWO::Layer& layer,
    unsigned int out[AI_MAX_NUMBER_OF_TEXTURECOORDS])
{
    unsigned int next = 0, extra = 0, num_extra = 0;

    // Check whether we have an UV entry != 0 for one of the faces in 'sorted'
    for (unsigned int i = 0; i < layer.mUVChannels.size();++i)  {
        LWO::UVChannel& uv = layer.mUVChannels[i];

        for (LWO::SortedRep::const_iterator it = sorted.begin(); it != sorted.end(); ++it)  {

            LWO::Face& face = layer.mFaces[*it];

            for (unsigned int n = 0; n < face.mNumIndices; ++n) {
                unsigned int idx = face.mIndices[n];

                if (uv.abAssigned[idx] && ((aiVector2D*)&uv.rawData[0])[idx] != aiVector2D()) {

                    if (extra >= AI_MAX_NUMBER_OF_TEXTURECOORDS) {

                        ASSIMP_LOG_ERROR("LWO: Maximum number of UV channels for "
                            "this mesh reached. Skipping channel \'" + uv.name + "\'");

                    }
                    else {
                        // Search through all textures assigned to 'surf' and look for this UV channel
                        char had = 0;
                        had |= FindUVChannels(surf.mColorTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mDiffuseTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mSpecularTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mGlossinessTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mOpacityTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mBumpTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mReflectionTextures,layer,uv,next);

                        // We have a texture referencing this UV channel so we have to take special care
                        // and are willing to drop unreferenced channels in favour of it.
                        if (had != 0) {
                            if (num_extra) {

                                for (unsigned int a = next; a < std::min( extra, AI_MAX_NUMBER_OF_TEXTURECOORDS-1u ); ++a) {
                                    out[a+1] = out[a];
                                }
                            }
                            ++extra;
                            out[next++] = i;
                        }
                        // Bah ... seems not to be used at all. Push to end if enough space is available.
                        else {
                            out[extra++] = i;
                            ++num_extra;
                        }
                    }
                    it = sorted.end()-1;
                    break;
                }
            }
        }
    }
    if (extra < AI_MAX_NUMBER_OF_TEXTURECOORDS) {
        out[extra] = UINT_MAX;
    }
}